

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  interval_t right_00;
  bool bVar1;
  timestamp_t tVar2;
  interval_t *piVar3;
  timestamp_t *ptVar4;
  Vector *in_RDX;
  Vector *in_RSI;
  timestamp_t *result_data;
  interval_t *rdata;
  timestamp_t *ldata;
  idx_t idx;
  ValidityMask *mask;
  undefined8 in_stack_ffffffffffffffc0;
  undefined1 fun_00;
  undefined7 uVar5;
  VectorType in_stack_ffffffffffffffcf;
  undefined1 uVar6;
  Vector *in_stack_ffffffffffffffd0;
  
  fun_00 = (undefined1)((ulong)in_stack_ffffffffffffffc0 >> 0x38);
  Vector::SetVectorType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  tVar2.value = (int64_t)ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0x12ec674);
  piVar3 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0x12ec683);
  ptVar4 = ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0x12ec692);
  uVar5 = SUB87(ptVar4,0);
  uVar6 = (undefined1)((ulong)ptVar4 >> 0x38);
  bVar1 = ConstantVector::IsNull((Vector *)0x12ec6a1);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x12ec6af), !bVar1)) {
    mask = (ValidityMask *)((timestamp_t *)tVar2.value)->value;
    idx = piVar3->micros;
    ConstantVector::Validity(in_RDX);
    right_00.days._3_1_ = uVar6;
    right_00._0_7_ = uVar5;
    right_00.micros = (int64_t)piVar3;
    tVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::SubtractOperator,duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                      ((bool)fun_00,tVar2,right_00,mask,idx);
    *(int64_t *)CONCAT17(uVar6,uVar5) = tVar2.value;
    return;
  }
  ConstantVector::SetNull(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}